

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O0

AbstractOutputStream * __thiscall BlurayHelper::createFile(BlurayHelper *this)

{
  BlurayHelper *this_local;
  
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    this_local = (BlurayHelper *)operator_new(0x38);
    File::File((File *)this_local);
  }
  else {
    this_local = (BlurayHelper *)IsoWriter::createFile(this->m_isoWriter);
  }
  return (AbstractOutputStream *)this_local;
}

Assistant:

AbstractOutputStream* BlurayHelper::createFile()
{
    if (m_isoWriter)
        return m_isoWriter->createFile();
    return new File();
}